

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Module> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
          (RefPtr<wabt::interp::Module> *__return_storage_ptr__,Store *this,Store *args,
          ModuleDesc *args_1)

{
  Module *this_00;
  Ref ref;
  Module *local_158;
  ModuleDesc local_150;
  
  this_00 = (Module *)operator_new(400);
  ModuleDesc::ModuleDesc(&local_150,args_1);
  Module::Module(this_00,args,&local_150);
  local_158 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Module*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_158);
  ModuleDesc::~ModuleDesc(&local_150);
  RefPtr<wabt::interp::Module>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Object).self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}